

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3AddDefaultValue(Parse *pParse,Expr *pExpr,char *zStart,char *zEnd)

{
  short sVar1;
  sqlite3 *db;
  Table *pTab;
  Column *pCVar2;
  Column *pCol;
  anon_union_8_2_443a03b8_for_u p;
  Expr *pExpr_00;
  long in_FS_OFFSET;
  Expr x;
  undefined1 local_88 [40];
  anon_union_8_18_67db040d_for_u aStack_60;
  undefined8 local_58;
  AggInfo *pAStack_50;
  anon_union_8_3_c79b3df9_for_y local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  db = pParse->db;
  pTab = pParse->pNewTable;
  if (pTab != (Table *)0x0) {
    if ((db->init).busy == '\0') {
      local_88._36_2_ = 4;
    }
    else {
      local_88._36_2_ = (db->init).iDb == '\x01' ^ 5;
    }
    pCVar2 = pTab->aCol;
    sVar1 = pTab->nCol;
    aStack_60.pNC = (NameContext *)&DAT_aaaaaaaaaaaaaaaa;
    local_88._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_88._32_4_ = -0x55555556;
    local_88._38_2_ = 0xaaaa;
    local_88._0_8_ = (Parse *)0x0;
    local_88._8_8_ = exprNodeIsConstant;
    local_88._16_8_ = sqlite3SelectWalkFail;
    if (pExpr != (Expr *)0x0) {
      sqlite3WalkExprNN((Walker *)local_88,pExpr);
    }
    pCol = pCVar2 + (long)sVar1 + -1;
    if (local_88._36_2_ == 0) {
      sqlite3ErrorMsg(pParse,"default value of column [%s] is not constant",pCol->zCnName);
    }
    else if ((pCVar2[(long)sVar1 + -1].colFlags & 0x60) == 0) {
      local_88._8_8_ = (_func_int_Walker_ptr_Expr_ptr *)0x0;
      local_88._16_8_ = (Expr *)0x0;
      local_88._24_8_ = (Expr *)0x0;
      local_88._32_8_ = (ExprList *)0x0;
      aStack_60.pNC = (NameContext *)0x0;
      local_58._0_2_ = 0;
      local_58._2_2_ = 0;
      local_58._4_4_ = (anon_union_4_2_009eaf8f_for_w)0x0;
      pAStack_50 = (AggInfo *)0x0;
      local_48.pTab = (Table *)0x0;
      local_88._0_8_ = (Parse *)0xb5;
      p.zToken = sqlite3DbSpanDup(db,zStart,zEnd);
      local_88._4_4_ = 0x2000;
      local_88._8_8_ = p.zToken;
      local_88._16_8_ = pExpr;
      pExpr_00 = exprDup(db,(Expr *)local_88,1,(EdupBuf *)0x0);
      if ((_func_int_Walker_ptr_Expr_ptr *)p.zToken != (_func_int_Walker_ptr_Expr_ptr *)0x0) {
        sqlite3DbFreeNN(db,p.zToken);
      }
      sqlite3ColumnSetExpr(pParse,pTab,pCol,pExpr_00);
    }
    else {
      sqlite3ErrorMsg(pParse,"cannot use DEFAULT on a generated column");
    }
  }
  if (1 < pParse->eParseMode) {
    sqlite3RenameExprUnmap(pParse,pExpr);
  }
  if (pExpr != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,pExpr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3AddDefaultValue(
  Parse *pParse,           /* Parsing context */
  Expr *pExpr,             /* The parsed expression of the default value */
  const char *zStart,      /* Start of the default value text */
  const char *zEnd         /* First character past end of default value text */
){
  Table *p;
  Column *pCol;
  sqlite3 *db = pParse->db;
  p = pParse->pNewTable;
  if( p!=0 ){
    int isInit = db->init.busy && db->init.iDb!=1;
    pCol = &(p->aCol[p->nCol-1]);
    if( !sqlite3ExprIsConstantOrFunction(pExpr, isInit) ){
      sqlite3ErrorMsg(pParse, "default value of column [%s] is not constant",
          pCol->zCnName);
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
    }else if( pCol->colFlags & COLFLAG_GENERATED ){
      testcase( pCol->colFlags & COLFLAG_VIRTUAL );
      testcase( pCol->colFlags & COLFLAG_STORED );
      sqlite3ErrorMsg(pParse, "cannot use DEFAULT on a generated column");
#endif
    }else{
      /* A copy of pExpr is used instead of the original, as pExpr contains
      ** tokens that point to volatile memory.
      */
      Expr x, *pDfltExpr;
      memset(&x, 0, sizeof(x));
      x.op = TK_SPAN;
      x.u.zToken = sqlite3DbSpanDup(db, zStart, zEnd);
      x.pLeft = pExpr;
      x.flags = EP_Skip;
      pDfltExpr = sqlite3ExprDup(db, &x, EXPRDUP_REDUCE);
      sqlite3DbFree(db, x.u.zToken);
      sqlite3ColumnSetExpr(pParse, p, pCol, pDfltExpr);
    }
  }
  if( IN_RENAME_OBJECT ){
    sqlite3RenameExprUnmap(pParse, pExpr);
  }
  sqlite3ExprDelete(db, pExpr);
}